

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O1

void Sym_ManPrintStats(Sym_Man_t *p)

{
  int level;
  
  printf("Total symm         = %8d.\n",(ulong)(uint)p->nPairsSymm);
  printf("Structural symm    = %8d.\n",(ulong)(uint)p->nPairsSymmStr);
  printf("Total non-sym      = %8d.\n",(ulong)(uint)p->nPairsNonSymm);
  printf("Total var pairs    = %8d.\n",(ulong)(uint)p->nPairsTotal);
  printf("Sat runs SAT       = %8d.\n",(ulong)(uint)p->nSatRunsSat);
  level = 0x879be3;
  printf("Sat runs UNSAT     = %8d.\n",(ulong)(uint)p->nSatRunsUnsat);
  Abc_Print(level,"%s =","Structural  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeStruct / 1000000.0);
  Abc_Print(level,"%s =","Simulation  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSim / 1000000.0);
  Abc_Print(level,"%s =","Matrix      ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeMatr / 1000000.0);
  Abc_Print(level,"%s =","Counting    ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeCount / 1000000.0);
  Abc_Print(level,"%s =","Fraiging    ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeFraig / 1000000.0);
  Abc_Print(level,"%s =","SAT         ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSat / 1000000.0);
  Abc_Print(level,"%s =","TOTAL       ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  return;
}

Assistant:

void Sym_ManPrintStats( Sym_Man_t * p )
{
//    printf( "Inputs = %5d. Outputs = %5d. Sim words = %5d.\n", 
//        Abc_NtkCiNum(p->pNtk), Abc_NtkCoNum(p->pNtk), p->nSimWords );
    printf( "Total symm         = %8d.\n", p->nPairsSymm );
    printf( "Structural symm    = %8d.\n", p->nPairsSymmStr );
    printf( "Total non-sym      = %8d.\n", p->nPairsNonSymm );
    printf( "Total var pairs    = %8d.\n", p->nPairsTotal );
    printf( "Sat runs SAT       = %8d.\n", p->nSatRunsSat );
    printf( "Sat runs UNSAT     = %8d.\n", p->nSatRunsUnsat );
    ABC_PRT( "Structural  ", p->timeStruct );
    ABC_PRT( "Simulation  ", p->timeSim );
    ABC_PRT( "Matrix      ", p->timeMatr );
    ABC_PRT( "Counting    ", p->timeCount );
    ABC_PRT( "Fraiging    ", p->timeFraig );
    ABC_PRT( "SAT         ", p->timeSat );
    ABC_PRT( "TOTAL       ", p->timeTotal );
}